

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

bool __thiscall ON_CheckSum::SetFileCheckSum(ON_CheckSum *this,FILE *fp)

{
  bool bVar1;
  ON__UINT32 current_remainder;
  long lVar2;
  ulong count;
  size_t sVar3;
  ulong uVar4;
  long local_458;
  time_t filetime;
  size_t filesize;
  uchar buffer [1024];
  
  Zero(this);
  if (fp == (FILE *)0x0) {
    bVar1 = false;
  }
  else {
    filesize = 0;
    filetime = 0;
    current_remainder = 0;
    bVar1 = ON::GetFileStats(fp,&filesize,(time_t *)0x0,&filetime);
    if (bVar1) {
      this->m_time = filetime;
    }
    local_458 = 0x40000;
    sVar3 = 0x400;
    uVar4 = 0;
    for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
      uVar4 = uVar4 + local_458;
      while (((int)sVar3 == 0x400 && (this->m_size < uVar4))) {
        sVar3 = fread(buffer,1,0x400,(FILE *)fp);
        if (0 < (int)(uint)sVar3) {
          count = (ulong)((uint)sVar3 & 0x7fffffff);
          this->m_size = this->m_size + count;
          current_remainder = ON_CRC32(current_remainder,count,buffer);
        }
      }
      local_458 = local_458 * 2;
      this->m_crc[lVar2] = current_remainder;
    }
    while ((int)sVar3 == 0x400) {
      sVar3 = fread(buffer,1,0x400,(FILE *)fp);
      if ((int)(uint)sVar3 < 1) break;
      uVar4 = (ulong)((uint)sVar3 & 0x7fffffff);
      this->m_size = this->m_size + uVar4;
      current_remainder = ON_CRC32(current_remainder,uVar4,buffer);
    }
    this->m_crc[7] = current_remainder;
    bVar1 = filesize == this->m_size;
  }
  return bVar1;
}

Assistant:

bool ON_CheckSum::SetFileCheckSum( FILE* fp )
{
  bool rc = false;
  Zero();
  if ( fp )
  {
    size_t filesize = 0;
    time_t filetime = 0;
    if ( ON::GetFileStats(fp,&filesize,nullptr,&filetime) )
    {
      m_time = filetime;
    }

    unsigned char buffer[1024];
    int count=1024;
    ON__INT32 crc = 0;
    size_t sz0 = 0, maxsize = 0x40000;

    for( int i = 0; i < 7; i++ )
    {
      sz0 += maxsize;
      while(1024 == count && m_size < sz0)
      {
        count = (int)fread( buffer, 1, 1024, fp ); // the (int) is for 64 bit size_t conversion
        if ( count > 0 )
        {
          m_size += count;
          crc = ON_CRC32( crc, count, buffer );
        }
      }
      maxsize *= 2;
      m_crc[i] = crc;
    }

    while(1024 == count)
    {
      count = (int)fread( buffer, 1, 1024, fp ); // the (int) is for 64 bit size_t conversion
      if ( count > 0 )
      {
        m_size += count;
        crc = ON_CRC32( crc, count, buffer );
      }
    }
    m_crc[7] = crc;

    rc = (filesize == m_size);
  }
  return rc;
}